

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.h
# Opt level: O1

void __thiscall
TPZMatrixSolver<float>::SetReferenceMatrix
          (TPZMatrixSolver<float> *this,TPZAutoPointer<TPZBaseMatrix> *matrix)

{
  TPZAutoPointer<TPZBaseMatrix> TStack_18;
  TPZAutoPointer<TPZBaseMatrix> local_10;
  
  local_10 = (TPZAutoPointer<TPZBaseMatrix>)matrix->fRef;
  LOCK();
  ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZAutoPointerDynamicCast<TPZMatrix<float>,TPZBaseMatrix>(&TStack_18);
  TPZAutoPointer<TPZMatrix<float>_>::operator=
            (&this->fReferenceMatrix,(TPZAutoPointer<TPZMatrix<float>_> *)&TStack_18);
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<float>_> *)&TStack_18);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_10);
  return;
}

Assistant:

virtual void SetReferenceMatrix(TPZAutoPointer<TPZBaseMatrix> matrix)
	{
		fReferenceMatrix = TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(matrix);
	}